

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

wchar_t prefix_c(char *start,char *end,char *test)

{
  char cVar1;
  char cVar2;
  wchar_t wVar3;
  char *pcVar4;
  char *pcVar5;
  
  wVar3 = L'\0';
  if ((start != end) && (*start == *test)) {
    pcVar5 = start + 1;
    pcVar4 = test + 1;
    do {
      if (end <= pcVar5) break;
      cVar1 = *pcVar5;
      pcVar5 = pcVar5 + 1;
      cVar2 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar1 == cVar2);
    wVar3 = (wchar_t)(end <= pcVar5);
  }
  return wVar3;
}

Assistant:

static int
prefix_c(const char *start, const char *end, const char *test)
{
	if (start == end)
		return (0);

	if (*start++ != *test++)
		return (0);

	while (start < end  &&  *start++ == *test++)
		;

	if (start < end)
		return (0);

	return (1);
}